

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::UCINewGameCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  int iVar2;
  Output OStack_18;
  char *params_local;
  
  params_local = params;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local);
  if (bVar1) {
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    std::operator<<((ostream *)&std::cout,(string *)token::UciNewGame_abi_cxx11_);
    Output::~Output(&OStack_18);
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Clear all search data.");
    Output::~Output(&OStack_18);
    return;
  }
  iVar2 = (*this->engine->_vptr_ChessEngine[8])();
  if ((char)iVar2 == '\0') {
    (*this->engine->_vptr_ChessEngine[7])();
  }
  (this->lastPosition)._M_string_length = 0;
  *(this->lastPosition)._M_dataplus._M_p = '\0';
  (*this->engine->_vptr_ChessEngine[0xe])();
  return;
}

Assistant:

void UCIAdapter::UCINewGameCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::UciNewGame;
    Output() << "Clear all search data.";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
  }
  lastPosition.clear();
  engine->ClearSearchData();
}